

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O0

void __thiscall XmlOutput::closeOpen(XmlOutput *this)

{
  undefined8 *in_RDI;
  
  if (1 < *(uint *)((long)in_RDI + 0x3c)) {
    QTextStream::operator<<((QTextStream *)*in_RDI,'>');
    *(undefined4 *)((long)in_RDI + 0x3c) = 1;
  }
  return;
}

Assistant:

void XmlOutput::closeOpen()
{
    switch(currentState) {
        case Bare:
        case Tag:
            return;
        case Attribute:
            break;
    }
    xmlFile << '>';
    currentState = Tag;
}